

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccs_test.cpp
# Opt level: O3

void __thiscall
CcsTest_FalseConflict_Test::~CcsTest_FalseConflict_Test(CcsTest_FalseConflict_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CcsTest, FalseConflict) {
  CcsDomain ccs(std::make_shared<FailingLogger>());
  std::istringstream input("a b : foo = 'bar'");
  ccs.loadCcsStream(input, "<literal>", ImportResolver::None);
  CcsContext ctx = ccs.build();

  EXPECT_EQ("bar", ctx.constrain("a").constrain("b").getString("foo"));
  EXPECT_EQ("bar", ctx.constrain("a").constrain("b").constrain("a")
      .getString("foo"));
}